

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp-test.cc
# Opt level: O2

void __thiscall SPTest_RandomRHS_Test::TestBody(SPTest_RandomRHS_Test *this)

{
  int iVar1;
  pointer piVar2;
  ColProblem *pCVar3;
  MockSpec<void_(int,_double)> *this_00;
  char *message;
  LinearConHandler LVar4;
  MatcherBase<double> local_868;
  MatcherBase<int> local_850;
  ColumnSizeHandler cols;
  MockScenarioHandler handler;
  SPAdapter sp;
  TestProblem p;
  NLHeader header;
  
  MakeHeader(&header,2,0);
  header.super_NLProblemInfo.super_NLProblemInfo_C.num_con_nonzeros = 1;
  TestProblem::TestProblem(&p,&header);
  TestProblem::MakeTestRV(&p);
  mp::BasicProblem<mp::BasicProblemParams<int>_>::AddCon
            ((BasicProblem<mp::BasicProblemParams<int>_> *)&p,0.0,0.0);
  cols.problem_ = p.builder_.super_NLProblemBuilder<mp::ColProblem>.builder_;
  mp::ColProblemBuilder::ColumnSizeHandler::Add(&cols,1);
  mp::ColProblemBuilder::ColumnSizeHandler::Add(&cols,0);
  LVar4 = TestProblem::OnLinearConExpr(&p,0);
  pCVar3 = LVar4.problem_;
  piVar2 = (pCVar3->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar2[1];
  piVar2[1] = iVar1 + 1;
  (pCVar3->row_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start[iVar1] = LVar4.con_index_;
  (pCVar3->coefs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iVar1] = 3.0;
  mp::SPAdapter::SPAdapter(&sp,&p.super_ColProblem);
  piVar2 = ((sp.problem_)->col_starts_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_850.impl_.value_._0_4_ =
       piVar2[*sp.var_core2orig_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start];
  local_868.impl_.value_._0_4_ =
       piVar2[(long)*sp.var_core2orig_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + 1];
  local_868._vptr_MatcherBase = (_func_int **)&sp;
  local_850._vptr_MatcherBase = (_func_int **)&sp;
  testing::internal::CmpHelperEQ<mp::SPAdapter::Column::Iterator,mp::SPAdapter::Column::Iterator>
            ((internal *)&handler,"col.begin()","col.end()",(Iterator *)&local_850,
             (Iterator *)&local_868);
  if ((char)handler.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.
            super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase == '\0') {
    testing::Message::Message((Message *)&local_850);
    if (handler.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.
        super_UntypedFunctionMockerBase.mock_obj_ == (void *)0x0) {
      message = "";
    }
    else {
      message = *handler.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.
                 super_UntypedFunctionMockerBase.mock_obj_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_868,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",0x237,
               message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_868,(Message *)&local_850);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_868);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_850);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&handler.gmock3_OnTerm_551.super_FunctionMockerBase<void_(int,_int,_double)>.
                  super_UntypedFunctionMockerBase.mock_obj_);
  MockScenarioHandler::MockScenarioHandler(&handler);
  testing::Matcher<int>::Matcher((Matcher<int> *)&local_850,0);
  testing::Matcher<double>::Matcher((Matcher<double> *)&local_868,-33.0);
  this_00 = MockScenarioHandler::gmock_OnRHS
                      (&handler,(Matcher<int> *)&local_850,(Matcher<double> *)&local_868);
  testing::internal::MockSpec<void_(int,_double)>::InternalExpectedAt
            (this_00,"/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/sp-test.cc",
             0x239,"handler","OnRHS(0, -33)");
  testing::internal::MatcherBase<double>::~MatcherBase(&local_868);
  testing::internal::MatcherBase<int>::~MatcherBase(&local_850);
  mp::SPAdapter::GetScenario<MockScenarioHandler>(&sp,0,&handler);
  MockScenarioHandler::~MockScenarioHandler(&handler);
  mp::SPAdapter::~SPAdapter(&sp);
  mp::ColProblem::~ColProblem(&p.super_ColProblem);
  return;
}

Assistant:

TEST(SPTest, RandomRHS) {
  auto header = MakeHeader(2);
  header.num_con_nonzeros = 1;
  TestProblem p(header);
  p.MakeTestRV();
  p.AddCon(0, 0);
  auto cols = p.OnColumnSizes();
  cols.Add(1);
  cols.Add(0);
  p.OnLinearConExpr(0).AddTerm(0, 3);
  mp::SPAdapter sp(p);
  auto col = sp.column(0);
  EXPECT_EQ(col.begin(), col.end());
  MockScenarioHandler handler;
  EXPECT_CALL(handler, OnRHS(0, -33));
  sp.GetScenario(0, handler);
}